

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O2

key_components * opensshcert_components(ssh_key *key)

{
  uint uVar1;
  key_component *pkVar2;
  ptrlen value;
  ptrlen value_00;
  ptrlen value_01;
  ptrlen value_02;
  ptrlen value_03;
  key_components *kc;
  strbuf *psVar3;
  ssh_key *psVar4;
  key_components *kc_00;
  char *pcVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  ptrlen ca_algname;
  ptrlen local_40;
  
  kc = (key_components *)(**(code **)((key[-1].vt)->new_pub + 0x60))();
  value.ptr = (key[-0xd].vt)->new_priv;
  value.len = (size_t)(key[-0xd].vt)->new_priv_openssh;
  key_components_add_binary(kc,"cert_nonce",value);
  key_components_add_uint(kc,"cert_serial",(uintmax_t)key[-0xc].vt);
  uVar1 = *(uint *)&key[-0xb].vt;
  if ((ulong)uVar1 == 1) {
    pcVar5 = "user";
  }
  else {
    if (uVar1 != 2) {
      key_components_add_uint(kc,"cert_type",(ulong)uVar1);
      goto LAB_0015a3e6;
    }
    pcVar5 = "host";
  }
  key_components_add_text(kc,"cert_type",pcVar5);
LAB_0015a3e6:
  key_components_add_text(kc,"cert_key_id",(char *)(key[-10].vt)->new_pub);
  opensshcert_string_list_key_components(kc,(strbuf *)key[-9].vt,"cert_valid_principal",(char *)0x0)
  ;
  key_components_add_uint(kc,"cert_valid_after",(uintmax_t)key[-8].vt);
  key_components_add_uint(kc,"cert_valid_before",(uintmax_t)key[-7].vt);
  if (key[-8].vt != (ssh_keyalg *)0x0) {
    psVar3 = strbuf_new();
    opensshcert_time_to_iso8601(psVar3->binarysink_,(uint64_t)key[-8].vt);
    value_00.ptr = psVar3->u;
    value_00.len = psVar3->len;
    key_components_add_text_pl(kc,"cert_valid_after_date",value_00);
    strbuf_free(psVar3);
  }
  if (key[-7].vt != (ssh_keyalg *)0xffffffffffffffff) {
    psVar3 = strbuf_new();
    opensshcert_time_to_iso8601(psVar3->binarysink_,(uint64_t)key[-7].vt);
    value_01.ptr = psVar3->u;
    value_01.len = psVar3->len;
    key_components_add_text_pl(kc,"cert_valid_before_date",value_01);
    strbuf_free(psVar3);
  }
  opensshcert_string_list_key_components
            (kc,(strbuf *)key[-6].vt,"cert_critical_option","cert_critical_option_data");
  opensshcert_string_list_key_components
            (kc,(strbuf *)key[-5].vt,"cert_extension","cert_extension_data");
  value_02.ptr = (key[-3].vt)->new_priv;
  value_02.len = (size_t)(key[-3].vt)->new_priv_openssh;
  key_components_add_binary(kc,"cert_ca_key",value_02);
  psVar4 = opensshcert_ca_pub_key((opensshcert_key *)(key + -0xd),(ptrlen)ZEXT816(0),&local_40);
  key_components_add_text_pl(kc,"cert_ca_key_algorithm_id",local_40);
  if (psVar4 != (ssh_key *)0x0) {
    kc_00 = (*psVar4->vt->components)(psVar4);
    lVar7 = 0;
    for (uVar6 = 0; uVar6 < kc_00->ncomponents; uVar6 = uVar6 + 1) {
      pkVar2 = kc_00->components;
      pcVar5 = dupcat_fn("cert_ca_key_",*(undefined8 *)((long)&pkVar2->name + lVar7),0);
      key_components_add_copy(kc,pcVar5,(key_component *)((long)&pkVar2->name + lVar7));
      safefree(pcVar5);
      lVar7 = lVar7 + 0x18;
    }
    key_components_free(kc_00);
    (*psVar4->vt->freekey)(psVar4);
  }
  value_03.ptr = (key[-2].vt)->new_priv;
  value_03.len = (size_t)(key[-2].vt)->new_priv_openssh;
  key_components_add_binary(kc,"cert_ca_sig",value_03);
  return kc;
}

Assistant:

static key_components *opensshcert_components(ssh_key *key)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);
    key_components *kc = ssh_key_components(ck->basekey);
    key_components_add_binary(kc, "cert_nonce", ptrlen_from_strbuf(ck->nonce));
    key_components_add_uint(kc, "cert_serial", ck->serial);
    switch (ck->type) {
      case SSH_CERT_TYPE_HOST:
        key_components_add_text(kc, "cert_type", "host");
        break;
      case SSH_CERT_TYPE_USER:
        key_components_add_text(kc, "cert_type", "user");
        break;
      default:
        key_components_add_uint(kc, "cert_type", ck->type);
        break;
    }
    key_components_add_text(kc, "cert_key_id", ck->key_id->s);
    opensshcert_string_list_key_components(kc, ck->valid_principals,
                                           "cert_valid_principal", NULL);
    key_components_add_uint(kc, "cert_valid_after", ck->valid_after);
    key_components_add_uint(kc, "cert_valid_before", ck->valid_before);
    /* Translate the validity period into human-legible dates, but
     * only if they're not the min/max integer. Rationale: if you see
     * "584554051223-11-09 07:00:15 UTC" as the expiry time you'll be
     * as likely to think it's a weird buffer overflow as half a
     * trillion years in the future! */
    if (ck->valid_after != 0) {
        strbuf *date = strbuf_new();
        opensshcert_time_to_iso8601(BinarySink_UPCAST(date), ck->valid_after);
        key_components_add_text_pl(kc, "cert_valid_after_date",
                                   ptrlen_from_strbuf(date));
        strbuf_free(date);
    }
    if (ck->valid_before != 0xFFFFFFFFFFFFFFFF) {
        strbuf *date = strbuf_new();
        opensshcert_time_to_iso8601(BinarySink_UPCAST(date), ck->valid_before);
        key_components_add_text_pl(kc, "cert_valid_before_date",
                                   ptrlen_from_strbuf(date));
        strbuf_free(date);
    }
    opensshcert_string_list_key_components(kc, ck->critical_options,
                                           "cert_critical_option",
                                           "cert_critical_option_data");
    opensshcert_string_list_key_components(kc, ck->extensions,
                                           "cert_extension",
                                           "cert_extension_data");
    key_components_add_binary(kc, "cert_ca_key", ptrlen_from_strbuf(
                                  ck->signature_key));

    ptrlen ca_algname;
    ssh_key *ca_key = opensshcert_ca_pub_key(ck, make_ptrlen(NULL, 0),
                                             &ca_algname);
    key_components_add_text_pl(kc, "cert_ca_key_algorithm_id", ca_algname);

    if (ca_key) {
        key_components *kc_ca_key = ssh_key_components(ca_key);
        for (size_t i = 0; i < kc_ca_key->ncomponents; i++) {
            key_component *comp = &kc_ca_key->components[i];
            char *subname = dupcat("cert_ca_key_", comp->name);
            key_components_add_copy(kc, subname, comp);
            sfree(subname);
        }
        key_components_free(kc_ca_key);
        ssh_key_free(ca_key);
    }

    key_components_add_binary(kc, "cert_ca_sig", ptrlen_from_strbuf(
                                  ck->signature));
    return kc;
}